

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

int Sbd_ManCheckConst(Sbd_Man_t *p,int Pivot)

{
  ulong *puVar1;
  uint uVar2;
  word *pwVar3;
  word **pVarSims;
  int *piVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  sat_solver *psVar8;
  uint *__ptr;
  void *pvVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong *puVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  int nCares [2];
  timespec ts;
  uint local_80 [4];
  ulong local_70;
  ulong *local_68;
  ulong local_60;
  word *local_58;
  Sbd_Man_t *local_50;
  timespec local_48;
  ulong local_38;
  
  uVar5 = p->pPars->nWords * Pivot;
  if ((((int)uVar5 < 0) || (p->vSims[0]->nSize <= (int)uVar5)) || (p->vSims[2]->nSize <= (int)uVar5)
     ) {
LAB_005326fa:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                  ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  if ((Pivot < 0) || (p->vObj2Var->nSize <= Pivot)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pwVar3 = p->vSims[0]->pArray;
  uVar16 = (ulong)uVar5;
  puVar15 = p->vSims[2]->pArray + uVar16;
  local_38 = (ulong)(uint)Pivot;
  local_60 = (ulong)(uint)p->vObj2Var->pArray[local_38];
  local_80[0] = 0;
  local_80[1] = 0;
  iVar6 = clock_gettime(3,&local_48);
  if (iVar6 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  psVar8 = Sbd_ManSatSolver(p->pSat,p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                            p->vRoots,0);
  p->pSat = psVar8;
  iVar6 = clock_gettime(3,&local_48);
  if (iVar6 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeCnf = p->timeCnf + lVar13 + lVar12;
  if (p->pSat == (sat_solver *)0x0) {
    pVVar10 = p->vLutLevs;
    uVar5 = 0;
  }
  else {
    p->vLits->nSize = 0;
    uVar18 = 0;
    do {
      if ((*puVar15 >> (uVar18 & 0x3f) & 1) == 0) {
        Vec_IntPush(p->vLits,(int)uVar18);
      }
      else {
        local_80[(pwVar3[uVar16] >> (uVar18 & 0x3f) & 1) != 0] =
             local_80[(pwVar3[uVar16] >> (uVar18 & 0x3f) & 1) != 0] + 1;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != 0x40);
    uVar5 = local_80[0];
    uVar7 = local_80[1];
    if (0 < (int)local_80[0] && 0 < (int)local_80[1]) {
      return -1;
    }
    uVar17 = 1 - local_80[0];
    if (0 < (int)local_80[0]) {
      uVar17 = 0;
    }
    uVar18 = (ulong)(1 - local_80[1]);
    if (0 < (int)local_80[1]) {
      uVar18 = 0;
    }
    local_80[1] = (int)uVar18;
    local_80[0] = uVar17;
    local_70 = uVar16;
    local_68 = puVar15;
    if (p->pPars->fVeryVerbose != 0) {
      printf("Computing %d offset and %d onset minterms for node %d.\n",(ulong)uVar17,uVar18,
             (ulong)(uint)Pivot);
    }
    local_80[3] = Pivot;
    local_58 = pwVar3;
    if (p->vLits->nSize < (int)(local_80[1] + local_80[0])) {
      uVar16 = 0;
      do {
        if ((int)(local_80[1] + local_80[0]) <= p->vLits->nSize) break;
        if ((int)uVar7 <= (int)uVar5 != ((local_58[local_70] >> (uVar16 & 0x3f) & 1) != 0)) {
          Vec_IntPush(p->vLits,(int)uVar16);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != 0x40);
    }
    else {
      p->vLits->nSize = local_80[1] + local_80[0];
    }
    uVar7 = (uint)local_60;
    __ptr = (uint *)malloc(0x10);
    uVar5 = 8;
    if (6 < uVar7) {
      uVar5 = uVar7 + 1;
    }
    __ptr[1] = 0;
    *__ptr = uVar5;
    uVar17 = 0;
    if (uVar5 == 0) {
      pvVar9 = (void *)0x0;
    }
    else {
      pvVar9 = malloc((long)(int)uVar5 << 3);
    }
    *(void **)(__ptr + 2) = pvVar9;
    pVVar10 = p->vWinObjs;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      local_50 = p;
      do {
        uVar5 = pVVar10->pArray[lVar12];
        uVar7 = local_50->pPars->nWords * uVar5;
        if (((int)uVar7 < 0) || (local_50->vSims[0]->nSize <= (int)uVar7)) goto LAB_005326fa;
        pwVar3 = local_50->vSims[0]->pArray;
        uVar17 = __ptr[1];
        uVar2 = *__ptr;
        if (uVar17 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar9 = malloc(0x80);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar14 = 0x10;
          }
          else {
            uVar14 = uVar2 * 2;
            if ((int)uVar14 <= (int)uVar2) goto LAB_00532569;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar9 = malloc((ulong)uVar2 << 4);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr + 2),(ulong)uVar2 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar9;
          *__ptr = uVar14;
        }
LAB_00532569:
        __ptr[1] = uVar17 + 1;
        *(word **)(*(long *)(__ptr + 2) + (long)(int)uVar17 * 8) = pwVar3 + uVar7;
        if (uVar5 == local_80[3]) break;
        lVar12 = lVar12 + 1;
        pVVar10 = local_50->vWinObjs;
      } while (lVar12 < pVVar10->nSize);
      uVar17 = (uint)lVar12;
      uVar7 = (uint)local_60;
      p = local_50;
    }
    puVar15 = local_68;
    uVar16 = local_70;
    if (uVar17 != uVar7) {
      __assert_fail("i == PivotVar",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x240,"int Sbd_ManCheckConst(Sbd_Man_t *, int)");
    }
    pVarSims = *(word ***)(__ptr + 2);
    uVar5 = Sbd_ManCollectConstants(p->pSat,(int *)local_80,uVar7,pVarSims,p->vLits);
    if (pVarSims != (word **)0x0) {
      free(pVarSims);
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
    Pivot = local_80[3];
    if ((int)uVar5 < 0) {
      lVar12 = (long)p->vLits->nSize;
      if (0 < lVar12) {
        piVar4 = p->vLits->pArray;
        lVar13 = 0;
        do {
          iVar6 = piVar4[lVar13];
          puVar1 = puVar15 + (iVar6 >> 6);
          *puVar1 = *puVar1 | 1L << ((byte)iVar6 & 0x3f);
          lVar13 = lVar13 + 1;
        } while (lVar12 != lVar13);
      }
      Sbd_ManPropagateControl(p,local_80[3]);
      uVar18 = *puVar15;
      uVar11 = 0;
      do {
        if ((uVar18 >> (uVar11 & 0x3f) & 1) != 0) {
          local_80[(local_58[uVar16] >> (uVar11 & 0x3f) & 1) != 0] =
               local_80[(local_58[uVar16] >> (uVar11 & 0x3f) & 1) != 0] + 1;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0x40);
      if ((0 < (int)local_80[0]) && (0 < (int)local_80[1])) {
        return -1;
      }
      __assert_fail("nCares[0] >= nMintCount && nCares[1] >= nMintCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x262,"int Sbd_ManCheckConst(Sbd_Man_t *, int)");
    }
    if (p->pPars->fVeryVerbose != 0) {
      printf("Found stuck-at-%d node %d.\n",(ulong)uVar5,(ulong)local_80[3]);
    }
    pVVar10 = p->vLutLevs;
  }
  if (Pivot < pVVar10->nSize) {
    pVVar10->pArray[local_38] = 0;
    p->nLuts[0] = p->nLuts[0] + 1;
    return uVar5;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

int Sbd_ManCheckConst( Sbd_Man_t * p, int Pivot )
{
    int nMintCount = 1;
    Vec_Ptr_t * vSims;
    word * pSims = Sbd_ObjSim0( p, Pivot );
    word * pCtrl = Sbd_ObjSim2( p, Pivot );
    int PivotVar = Vec_IntEntry(p->vObj2Var, Pivot);
    int RetValue, i, iObj, Ind, fFindOnset, nCares[2] = {0};

    abctime clk = Abc_Clock();
    p->pSat = Sbd_ManSatSolver( p->pSat, p->pGia, p->vMirrors, Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots, 0 );
    p->timeCnf += Abc_Clock() - clk;
    if ( p->pSat == NULL )
    {
        //if ( p->pPars->fVerbose )
        //    printf( "Found stuck-at-%d node %d.\n", 0, Pivot );
        Vec_IntWriteEntry( p->vLutLevs, Pivot, 0 );
        p->nLuts[0]++;
        return 0;
    }
    //return -1;
    //Sbd_ManPrintObj( p, Pivot );

    // count the number of on-set and off-set care-set minterms
    Vec_IntClear( p->vLits );
    for ( i = 0; i < 64; i++ )
        if ( Abc_TtGetBit(pCtrl, i) )
            nCares[Abc_TtGetBit(pSims, i)]++;
        else
            Vec_IntPush( p->vLits, i );
    fFindOnset = (int)(nCares[0] < nCares[1]);
    if ( nCares[0] >= nMintCount && nCares[1] >= nMintCount )
        return -1;
    // find how many do we need
    nCares[0] = nCares[0] < nMintCount ? nMintCount - nCares[0] : 0;
    nCares[1] = nCares[1] < nMintCount ? nMintCount - nCares[1] : 0;

    if ( p->pPars->fVeryVerbose )
        printf( "Computing %d offset and %d onset minterms for node %d.\n", nCares[0], nCares[1], Pivot );

    if ( Vec_IntSize(p->vLits) >= nCares[0] + nCares[1] )
        Vec_IntShrink( p->vLits, nCares[0] + nCares[1] );
    else
    {
        // collect places to insert new minterms
        for ( i = 0; i < 64 && Vec_IntSize(p->vLits) < nCares[0] + nCares[1]; i++ )
            if ( fFindOnset == Abc_TtGetBit(pSims, i) )
                Vec_IntPush( p->vLits, i );
    }
    // collect simulation pointers
    vSims = Vec_PtrAlloc( PivotVar + 1 );
    Vec_IntForEachEntry( p->vWinObjs, iObj, i )
    {
        Vec_PtrPush( vSims, Sbd_ObjSim0(p, iObj) );
        if ( iObj == Pivot )
            break;
    }
    assert( i == PivotVar );
    // compute patterns
    RetValue = Sbd_ManCollectConstants( p->pSat, nCares, PivotVar, (word **)Vec_PtrArray(vSims), p->vLits );
    // print computed miterms
    if ( 0 && RetValue < 0 )
    {
        Vec_Int_t * vPis = Vec_WecEntry(p->vDivLevels, 0);
        int i, k, Ind;
        printf( "Additional minterms:\n" );
        Vec_IntForEachEntry( p->vLits, Ind, k )
        {
            for ( i = 0; i < Vec_IntSize(vPis); i++ )
                printf( "%d", Abc_TtGetBit( (word *)Vec_PtrEntry(vSims, Vec_IntEntry(p->vWinObjs, i)), Ind ) );
            printf( "\n" );
        }
    }
    Vec_PtrFree( vSims );
    if ( RetValue >= 0 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "Found stuck-at-%d node %d.\n", RetValue, Pivot );
        Vec_IntWriteEntry( p->vLutLevs, Pivot, 0 );
        p->nLuts[0]++;
        return RetValue;
    }
    // set controlability of these minterms
    Vec_IntForEachEntry( p->vLits, Ind, i )
        Abc_TtSetBit( pCtrl, Ind );
    // propagate controlability to fanins for the TFI nodes starting from the pivot
    Sbd_ManPropagateControl( p, Pivot );
    // double check that we now have enough minterms
    for ( i = 0; i < 64; i++ )
        if ( Abc_TtGetBit(pCtrl, i) )
            nCares[Abc_TtGetBit(pSims, i)]++;
    assert( nCares[0] >= nMintCount && nCares[1] >= nMintCount );
    return -1;
}